

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall
QL_Manager::Delete(QL_Manager *this,char *relName,int nConditions,Condition *conditions)

{
  ostream *poVar1;
  RelCatEntry *pRVar2;
  AttrCatEntry *pAVar3;
  QL_Node *local_d0;
  QL_Node *topNode;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char local_bc [44];
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  int local_70;
  char acStack_6c [4];
  int i_1;
  char local_64 [20];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined1 local_3c;
  RC local_38;
  int local_34;
  RC rc;
  int i;
  Condition *conditions_local;
  char *pcStack_20;
  int nConditions_local;
  char *relName_local;
  QL_Manager *this_local;
  
  _rc = conditions;
  conditions_local._4_4_ = nConditions;
  pcStack_20 = relName;
  relName_local = (char *)this;
  std::operator<<((ostream *)&std::cout,"Delete\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"   relName = ");
  poVar1 = std::operator<<(poVar1,pcStack_20);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"   nCondtions = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,conditions_local._4_4_);
  std::operator<<(poVar1,"\n");
  for (local_34 = 0; local_34 < conditions_local._4_4_; local_34 = local_34 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"   conditions[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_34);
    poVar1 = std::operator<<(poVar1,"]:");
    poVar1 = operator<<(poVar1,_rc + local_34);
    std::operator<<(poVar1,"\n");
  }
  local_38 = 0;
  Reset(this);
  this->condptr = _rc;
  this->nConds = conditions_local._4_4_;
  pRVar2 = (RelCatEntry *)malloc(0x34);
  this->relEntries = pRVar2;
  memset(this->relEntries,0,0x34);
  acStack_6c[0] = '\0';
  acStack_6c[1] = '\0';
  acStack_6c[2] = '\0';
  acStack_6c[3] = '\0';
  i_1._0_1_ = '\0';
  i_1._1_1_ = '\0';
  i_1._2_1_ = '\0';
  i_1._3_1_ = '\0';
  local_64[0] = '\0';
  local_64[1] = '\0';
  local_64[2] = '\0';
  local_64[3] = '\0';
  local_64[4] = '\0';
  local_64[5] = '\0';
  local_64[6] = '\0';
  local_64[7] = '\0';
  local_64[8] = '\0';
  local_64[9] = '\0';
  local_64[10] = '\0';
  local_64[0xb] = '\0';
  local_64[0xc] = '\0';
  local_64[0xd] = '\0';
  local_64[0xe] = '\0';
  local_64[0xf] = '\0';
  local_64[0x10] = 0;
  local_50 = 0;
  local_4c = 0;
  local_48 = 0;
  local_44 = 0;
  local_40 = 0;
  local_3c = 1;
  memcpy(this->relEntries,acStack_6c,0x34);
  local_38 = SetUpOneRelation(this,pcStack_20);
  if (local_38 == 0) {
    pAVar3 = (AttrCatEntry *)malloc((long)this->relEntries->attrCount * 0x54);
    this->attrEntries = pAVar3;
    memset(this->attrEntries,0,0x54);
    for (local_70 = 0; local_70 < this->relEntries->attrCount; local_70 = local_70 + 1) {
      topNode._4_1_ = '\0';
      topNode._5_1_ = '\0';
      topNode._6_1_ = '\0';
      topNode._7_1_ = '\0';
      cStack_c0 = '\0';
      cStack_bf = '\0';
      cStack_be = '\0';
      cStack_bd = '\0';
      local_bc[0] = '\0';
      local_bc[1] = '\0';
      local_bc[2] = '\0';
      local_bc[3] = '\0';
      local_bc[4] = '\0';
      local_bc[5] = '\0';
      local_bc[6] = '\0';
      local_bc[7] = '\0';
      local_bc[8] = '\0';
      local_bc[9] = '\0';
      local_bc[10] = '\0';
      local_bc[0xb] = '\0';
      local_bc[0xc] = '\0';
      local_bc[0xd] = '\0';
      local_bc[0xe] = '\0';
      local_bc[0xf] = '\0';
      local_bc[0x10] = 0;
      local_bc[0x11] = '\0';
      local_bc[0x12] = '\0';
      local_bc[0x13] = '\0';
      local_bc[0x14] = '\0';
      local_bc[0x15] = '\0';
      local_bc[0x16] = '\0';
      local_bc[0x17] = '\0';
      local_bc[0x18] = '\0';
      local_bc[0x19] = '\0';
      local_bc[0x1a] = '\0';
      local_bc[0x1b] = '\0';
      local_bc[0x1c] = '\0';
      local_bc[0x1d] = '\0';
      local_bc[0x1e] = '\0';
      local_bc[0x1f] = '\0';
      local_bc[0x20] = '\0';
      local_bc[0x21] = '\0';
      local_bc[0x22] = '\0';
      local_bc[0x23] = '\0';
      local_bc[0x24] = '\0';
      local_bc[0x25] = '\0';
      local_bc[0x26] = '\0';
      local_bc[0x27] = '\0';
      local_bc[0x28] = '\0';
      local_bc[0x29] = 0;
      local_90 = 0;
      local_8c = 0;
      local_88 = 0;
      local_84 = 0;
      local_80 = 0;
      local_7c = 0;
      local_78 = 0x800000;
      local_74 = 0x7f7fffff;
      memcpy(this->attrEntries + local_70,(void *)((long)&topNode + 4),0x54);
    }
    local_38 = SM_Manager::GetAttrForRel
                         (this->smm,this->relEntries,this->attrEntries,&this->attrToRel);
    if (local_38 == 0) {
      local_38 = ParseConditions(this,conditions_local._4_4_,_rc);
      if (local_38 == 0) {
        local_38 = SetUpFirstNode(this,&local_d0);
        this_local._4_4_ = local_38;
        if (local_38 == 0) {
          if (bQueryPlans != 0) {
            poVar1 = std::operator<<((ostream *)&std::cout,"PRINTING QUERY PLAN");
            std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
            (*local_d0->_vptr_QL_Node[5])(local_d0,0);
          }
          local_38 = RunDelete(this,local_d0);
          this_local._4_4_ = local_38;
          if ((local_38 == 0) &&
             (local_38 = CleanUpNodes(this,local_d0), this_local._4_4_ = local_38, local_38 == 0)) {
            free(this->relEntries);
            free(this->attrEntries);
            this_local._4_4_ = 0;
          }
        }
      }
      else {
        free(this->relEntries);
        free(this->attrEntries);
        this_local._4_4_ = local_38;
      }
    }
    else {
      free(this->relEntries);
      free(this->attrEntries);
      this_local._4_4_ = local_38;
    }
  }
  else {
    free(this->relEntries);
    this_local._4_4_ = local_38;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::Delete(const char *relName,
                      int nConditions, const Condition conditions[])
{
  int i;

  cout << "Delete\n";

  cout << "   relName = " << relName << "\n";
  cout << "   nCondtions = " << nConditions << "\n";
  for (i = 0; i < nConditions; i++)
    cout << "   conditions[" << i << "]:" << conditions[i] << "\n";

  RC rc = 0;
  Reset();
  condptr = conditions;
  nConds = nConditions;
  
  // Make space for relation 
  relEntries = (RelCatEntry *)malloc(sizeof(RelCatEntry));
  memset((void*)relEntries, 0, sizeof(*relEntries));
  *relEntries = (RelCatEntry) {"\0", 0, 0, 0, 0, 0, true};
  if((rc = SetUpOneRelation(relName))){
    free(relEntries);
    return (rc);
  }
  // Make space for the list of attributes in this relation
  attrEntries = (AttrCatEntry *)malloc(relEntries->attrCount * sizeof(AttrCatEntry));
  memset((void*)attrEntries, 0, sizeof(*attrEntries));
  for(int i= 0 ; i < relEntries->attrCount; i++){
    *(attrEntries+i) = (AttrCatEntry) {"\0", "\0", 0, INT, 0, 0, 0, 0, FLT_MIN, FLT_MAX};
  }
  if((rc = smm.GetAttrForRel(relEntries, attrEntries, attrToRel))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }

  // Makes sure that the conditions are appropriate
  if(rc = ParseConditions(nConditions, conditions)){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }

   // Create the query tree nodes
    QL_Node *topNode;
    if((rc = SetUpFirstNode(topNode)))
    return (rc);

  // Print the query plan
  if(bQueryPlans){
    cout << "PRINTING QUERY PLAN" <<endl;
    topNode->PrintNode(0);
  }
  
  if((rc = RunDelete(topNode))) // Run delete
    return (rc);
  
  if(rc = CleanUpNodes(topNode)) // Clean up the nodes
    return (rc);

  free(relEntries);
  free(attrEntries);

  return 0;
}